

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void report(basic_ostream<char,_std::char_traits<char>_> *stream,NodeList *points)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference ppNVar4;
  vector<Node_*,_std::allocator<Node_*>_> *in_RSI;
  vector<Node_*,_std::allocator<Node_*>_> *in_RDI;
  Node *n;
  iterator __end1;
  iterator __begin1;
  NodeList *__range1;
  Node *in_stack_ffffffffffffffd0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  vector<Node_*,_std::allocator<Node_*>_> *local_18;
  vector<Node_*,_std::allocator<Node_*>_> *local_10;
  vector<Node_*,_std::allocator<Node_*>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(in_RDI,sVar2);
  std::operator<<(poVar3," ");
  local_18 = local_10;
  local_20._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(in_RDI);
  std::vector<Node_*,_std::allocator<Node_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       in_stack_ffffffffffffffd0,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppNVar4;
    poVar3 = (ostream *)std::ostream::operator<<(local_8,in_stack_ffffffffffffffd0->id);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_20);
  }
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void report(std::basic_ostream<char>& stream, NodeList& points) {
    stream << points.size() << " ";
    for (Node* n : points) {
        stream << n->id << " ";
    }
    stream << std::endl;
}